

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.h
# Opt level: O0

void __thiscall
cmFindBaseDebugState::DebugLibState::DebugLibState(DebugLibState *this,string *n,string *p)

{
  string *p_local;
  string *n_local;
  DebugLibState *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)n);
  std::__cxx11::string::string((string *)&this->path,(string *)p);
  return;
}

Assistant:

DebugLibState(std::string&& n, std::string p)
      : regexName(n)
      , path(std::move(p))
    {
    }